

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCoberturaCoverage.cxx
# Opt level: O2

void __thiscall cmParseCoberturaCoverage::XMLParser::EndElement(XMLParser *this,string *name)

{
  bool bVar1;
  
  bVar1 = std::operator==(name,"source");
  if (bVar1) {
    this->InSource = false;
  }
  else {
    bVar1 = std::operator==(name,"sources");
    if (bVar1) {
      this->InSources = false;
    }
    else {
      bVar1 = std::operator==(name,"class");
      if (bVar1) {
        this->SkipThisClass = false;
      }
    }
  }
  return;
}

Assistant:

void EndElement(const std::string& name) override
  {
    if (name == "source") {
      this->InSource = false;
    } else if (name == "sources") {
      this->InSources = false;
    } else if (name == "class") {
      this->SkipThisClass = false;
    }
  }